

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::ColumnMetaData::write(ColumnMetaData *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  reference pKVar5;
  ssize_t sVar6;
  reference pPVar7;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  const_iterator _iter123;
  const_iterator _iter122;
  const_iterator _iter121;
  const_iterator _iter120;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  uint32_t in_stack_fffffffffffffe28;
  TType in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  __normal_iterator<const_duckdb_parquet::PageEncodingStats_*,_std::vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>_>
  local_80;
  KeyValue *local_78;
  KeyValue *local_70;
  __normal_iterator<const_duckdb_parquet::KeyValue_*,_std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  type *local_48;
  type *local_40;
  __normal_iterator<const_duckdb_parquet::Encoding::type_*,_std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>_>
  local_38 [4];
  uint local_14;
  undefined8 local_10;
  ColumnMetaData *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_14 = 0;
  local_8 = this;
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker
            ((TOutputRecursionTracker *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (TProtocol *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeStructBegin
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                     0x225);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe2c);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x225363e);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                     0x225);
  local_14 = local_14 + uVar2;
  std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>::size
            (&(this->encodings).
              super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
            );
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeListBegin
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
  local_14 = uVar2 + local_14;
  __gnu_cxx::
  __normal_iterator<const_duckdb_parquet::Encoding::type_*,_std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>_>
  ::__normal_iterator(local_38);
  local_40 = (type *)std::
                     vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                     ::begin((vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                              *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_38[0]._M_current = local_40;
  while( true ) {
    local_48 = (type *)std::
                       vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                       ::end((vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                              *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_duckdb_parquet::Encoding::type_*,_std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (__normal_iterator<const_duckdb_parquet::Encoding::type_*,_std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_duckdb_parquet::Encoding::type_*,_std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>_>
    ::operator*(local_38);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       in_stack_fffffffffffffe2c);
    local_14 = uVar2 + local_14;
    __gnu_cxx::
    __normal_iterator<const_duckdb_parquet::Encoding::type_*,_std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>_>
    ::operator++(local_38);
  }
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeListEnd((TProtocol *)0x22537eb);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x2253818);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                     0x225);
  local_14 = local_14 + uVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&this->path_in_schema);
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeListBegin
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
  local_14 = uVar2 + local_14;
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::__normal_iterator(&local_50);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_50._M_current = local_58;
  while( true ) {
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_50);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeString
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (string *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_14 = uVar2 + local_14;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_50);
  }
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeListEnd((TProtocol *)0x225399d);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x22539ca);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                     0x225);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe2c);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x2253a6d);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                     0x225);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI64
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x2253b11);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                     0x225);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI64
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x2253bb5);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                     0x225);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI64
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x2253c59);
  local_14 = uVar2 + local_14;
  if (((byte)this->__isset & 1) != 0) {
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                       0x225);
    local_14 = local_14 + uVar2;
    std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::size
              (&(this->key_value_metadata).
                super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeListBegin
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
    local_14 = uVar2 + local_14;
    __gnu_cxx::
    __normal_iterator<const_duckdb_parquet::KeyValue_*,_std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>_>
    ::__normal_iterator(&local_68);
    local_70 = (KeyValue *)
               std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::
               begin((vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_> *)
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_68._M_current = local_70;
    while( true ) {
      local_78 = (KeyValue *)
                 std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::
                 end((vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_> *)
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_duckdb_parquet::KeyValue_*,_std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         (__normal_iterator<const_duckdb_parquet::KeyValue_*,_std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (!bVar1) break;
      pKVar5 = __gnu_cxx::
               __normal_iterator<const_duckdb_parquet::KeyValue_*,_std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>_>
               ::operator*(&local_68);
      iVar3 = (**(code **)(*(long *)pKVar5 + 0x18))(pKVar5,local_10);
      local_14 = iVar3 + local_14;
      __gnu_cxx::
      __normal_iterator<const_duckdb_parquet::KeyValue_*,_std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>_>
      ::operator++(&local_68);
    }
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeListEnd((TProtocol *)0x2253de8);
    local_14 = local_14 + uVar2;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x2253e15);
    local_14 = uVar2 + local_14;
  }
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                     0x225);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI64
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x2253eb7);
  local_14 = uVar2 + local_14;
  if (((byte)this->__isset >> 1 & 1) != 0) {
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                       0x225);
    local_14 = local_14 + uVar2;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI64
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_14 = local_14 + uVar2;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x2253f67);
    local_14 = uVar2 + local_14;
  }
  if (((byte)this->__isset >> 2 & 1) != 0) {
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                       0x225);
    local_14 = local_14 + uVar2;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI64
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_14 = local_14 + uVar2;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x2254015);
    local_14 = uVar2 + local_14;
  }
  if (((byte)this->__isset >> 3 & 1) != 0) {
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                       0x225);
    local_14 = local_14 + uVar2;
    sVar6 = Statistics::write(&this->statistics,(int)local_10,__buf_00,(ulong)uVar2);
    local_14 = local_14 + (int)sVar6;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x22540c0);
    local_14 = uVar2 + local_14;
  }
  if (((byte)this->__isset >> 4 & 1) != 0) {
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                       0x225);
    local_14 = local_14 + uVar2;
    std::
    vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>::
    size(&(this->encoding_stats).
          super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
        );
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeListBegin
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
    local_14 = uVar2 + local_14;
    __gnu_cxx::
    __normal_iterator<const_duckdb_parquet::PageEncodingStats_*,_std::vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>_>
    ::__normal_iterator(&local_80);
    local_80._M_current =
         (PageEncodingStats *)
         std::
         vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
         ::begin((vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                  *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    while( true ) {
      std::
      vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
      ::end((vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
             *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_duckdb_parquet::PageEncodingStats_*,_std::vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         (__normal_iterator<const_duckdb_parquet::PageEncodingStats_*,_std::vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (!bVar1) break;
      pPVar7 = __gnu_cxx::
               __normal_iterator<const_duckdb_parquet::PageEncodingStats_*,_std::vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>_>
               ::operator*(&local_80);
      iVar3 = (**(code **)(*(long *)pPVar7 + 0x18))(pPVar7,local_10);
      local_14 = iVar3 + local_14;
      __gnu_cxx::
      __normal_iterator<const_duckdb_parquet::PageEncodingStats_*,_std::vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>_>
      ::operator++(&local_80);
    }
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeListEnd((TProtocol *)0x225423a);
    local_14 = local_14 + uVar2;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x2254261);
    local_14 = uVar2 + local_14;
  }
  if (((byte)this->__isset >> 5 & 1) != 0) {
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                       0x225);
    local_14 = local_14 + uVar2;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI64
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_14 = local_14 + uVar2;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x225430f);
    local_14 = uVar2 + local_14;
  }
  if (((byte)this->__isset >> 6 & 1) != 0) {
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                       0x225);
    local_14 = local_14 + uVar2;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeI32
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       in_stack_fffffffffffffe2c);
    local_14 = local_14 + uVar2;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x22543bc);
    local_14 = uVar2 + local_14;
  }
  if ((char)this->__isset < '\0') {
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),T_STOP,
                       0x225);
    local_14 = local_14 + uVar2;
    sVar6 = SizeStatistics::write(&this->size_statistics,(int)local_10,__buf_01,(ulong)uVar2);
    local_14 = local_14 + (int)sVar6;
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x2254468);
    local_14 = uVar2 + local_14;
  }
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldStop((TProtocol *)0x225448d);
  local_14 = local_14 + uVar2;
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeStructEnd((TProtocol *)0x22544b4);
  uVar4 = uVar2 + local_14;
  local_14 = uVar4;
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker
            ((TOutputRecursionTracker *)0x22544e4);
  return (ulong)uVar4;
}

Assistant:

uint32_t ColumnMetaData::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("ColumnMetaData");

  xfer += oprot->writeFieldBegin("type", ::apache::thrift::protocol::T_I32, 1);
  xfer += oprot->writeI32(static_cast<int32_t>(this->type));
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("encodings", ::apache::thrift::protocol::T_LIST, 2);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_I32, static_cast<uint32_t>(this->encodings.size()));
    duckdb::vector<Encoding::type> ::const_iterator _iter120;
    for (_iter120 = this->encodings.begin(); _iter120 != this->encodings.end(); ++_iter120)
    {
      xfer += oprot->writeI32(static_cast<int32_t>((*_iter120)));
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("path_in_schema", ::apache::thrift::protocol::T_LIST, 3);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRING, static_cast<uint32_t>(this->path_in_schema.size()));
    duckdb::vector<std::string> ::const_iterator _iter121;
    for (_iter121 = this->path_in_schema.begin(); _iter121 != this->path_in_schema.end(); ++_iter121)
    {
      xfer += oprot->writeString((*_iter121));
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("codec", ::apache::thrift::protocol::T_I32, 4);
  xfer += oprot->writeI32(static_cast<int32_t>(this->codec));
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("num_values", ::apache::thrift::protocol::T_I64, 5);
  xfer += oprot->writeI64(this->num_values);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("total_uncompressed_size", ::apache::thrift::protocol::T_I64, 6);
  xfer += oprot->writeI64(this->total_uncompressed_size);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("total_compressed_size", ::apache::thrift::protocol::T_I64, 7);
  xfer += oprot->writeI64(this->total_compressed_size);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.key_value_metadata) {
    xfer += oprot->writeFieldBegin("key_value_metadata", ::apache::thrift::protocol::T_LIST, 8);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->key_value_metadata.size()));
      duckdb::vector<KeyValue> ::const_iterator _iter122;
      for (_iter122 = this->key_value_metadata.begin(); _iter122 != this->key_value_metadata.end(); ++_iter122)
      {
        xfer += (*_iter122).write(oprot);
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldBegin("data_page_offset", ::apache::thrift::protocol::T_I64, 9);
  xfer += oprot->writeI64(this->data_page_offset);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.index_page_offset) {
    xfer += oprot->writeFieldBegin("index_page_offset", ::apache::thrift::protocol::T_I64, 10);
    xfer += oprot->writeI64(this->index_page_offset);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.dictionary_page_offset) {
    xfer += oprot->writeFieldBegin("dictionary_page_offset", ::apache::thrift::protocol::T_I64, 11);
    xfer += oprot->writeI64(this->dictionary_page_offset);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.statistics) {
    xfer += oprot->writeFieldBegin("statistics", ::apache::thrift::protocol::T_STRUCT, 12);
    xfer += this->statistics.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.encoding_stats) {
    xfer += oprot->writeFieldBegin("encoding_stats", ::apache::thrift::protocol::T_LIST, 13);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->encoding_stats.size()));
      duckdb::vector<PageEncodingStats> ::const_iterator _iter123;
      for (_iter123 = this->encoding_stats.begin(); _iter123 != this->encoding_stats.end(); ++_iter123)
      {
        xfer += (*_iter123).write(oprot);
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.bloom_filter_offset) {
    xfer += oprot->writeFieldBegin("bloom_filter_offset", ::apache::thrift::protocol::T_I64, 14);
    xfer += oprot->writeI64(this->bloom_filter_offset);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.bloom_filter_length) {
    xfer += oprot->writeFieldBegin("bloom_filter_length", ::apache::thrift::protocol::T_I32, 15);
    xfer += oprot->writeI32(this->bloom_filter_length);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.size_statistics) {
    xfer += oprot->writeFieldBegin("size_statistics", ::apache::thrift::protocol::T_STRUCT, 16);
    xfer += this->size_statistics.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}